

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_readSkippableFrame
                 (void *dst,size_t dstCapacity,uint *magicVariant,void *src,size_t srcSize)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = 0xffffffffffffffb8;
  if (7 < srcSize) {
    uVar3 = (ulong)*(uint *)((long)src + 4) + 8;
    if (srcSize < uVar3) {
      uVar3 = 0xffffffffffffffb8;
    }
    if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
      uVar3 = 0xfffffffffffffff2;
    }
    uVar1 = *src;
    sVar2 = 0xfffffffffffffff2;
    if (((uVar1 & 0xfffffff0) == 0x184d2a50) && (sVar2 = 0xffffffffffffffb8, uVar3 <= srcSize)) {
      uVar3 = uVar3 - 8;
      sVar2 = 0xffffffffffffffba;
      if (uVar3 <= dstCapacity) {
        if ((dst != (void *)0x0) && (uVar3 != 0)) {
          memcpy(dst,(void *)((long)src + 8),uVar3);
        }
        sVar2 = uVar3;
        if (magicVariant != (uint *)0x0) {
          *magicVariant = uVar1 + 0xe7b2d5b0;
        }
      }
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_readSkippableFrame(void* dst, size_t dstCapacity,
                               unsigned* magicVariant,  /* optional, can be NULL */
                         const void* src, size_t srcSize)
{
    RETURN_ERROR_IF(srcSize < ZSTD_SKIPPABLEHEADERSIZE, srcSize_wrong, "");

    {   U32 const magicNumber = MEM_readLE32(src);
        size_t skippableFrameSize = readSkippableFrameSize(src, srcSize);
        size_t skippableContentSize = skippableFrameSize - ZSTD_SKIPPABLEHEADERSIZE;

        /* check input validity */
        RETURN_ERROR_IF(!ZSTD_isSkippableFrame(src, srcSize), frameParameter_unsupported, "");
        RETURN_ERROR_IF(skippableFrameSize < ZSTD_SKIPPABLEHEADERSIZE || skippableFrameSize > srcSize, srcSize_wrong, "");
        RETURN_ERROR_IF(skippableContentSize > dstCapacity, dstSize_tooSmall, "");

        /* deliver payload */
        if (skippableContentSize > 0  && dst != NULL)
            ZSTD_memcpy(dst, (const BYTE *)src + ZSTD_SKIPPABLEHEADERSIZE, skippableContentSize);
        if (magicVariant != NULL)
            *magicVariant = magicNumber - ZSTD_MAGIC_SKIPPABLE_START;
        return skippableContentSize;
    }
}